

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

errr finish_parse_player_prop(parser *p)

{
  player_bound_ui *ppVar1;
  embryo_player_ability *peVar2;
  int iVar3;
  player_ability *ability;
  player_ability *ppVar4;
  char *pcVar5;
  char *pcVar6;
  uint16_t i;
  long lVar7;
  embryo_player_ability *p_00;
  
  p_00 = embryo_player_abilities;
  embryo_player_abilities = (embryo_player_ability *)0x0;
  ability = (player_ability *)mem_zalloc(0x30);
  player_abilities = ability;
  if (p_00 != (embryo_player_ability *)0x0) {
    do {
      pcVar5 = (p_00->ability).type;
      iVar3 = strcmp(pcVar5,"element");
      if (iVar3 == 0) {
        lVar7 = 0;
        do {
          pcVar5 = string_make(projections[lVar7].name);
          ability->index = (uint16_t)lVar7;
          pcVar6 = string_make((p_00->ability).type);
          ability->type = pcVar6;
          pcVar6 = format("%s %s.",(p_00->ability).desc,pcVar5);
          pcVar6 = string_make(pcVar6);
          ability->desc = pcVar6;
          my_strcap(pcVar5);
          pcVar6 = format("%s %s",pcVar5,(p_00->ability).name);
          pcVar6 = string_make(pcVar6);
          ability->name = pcVar6;
          string_free(pcVar5);
          ability->value = (p_00->ability).value;
          for (ppVar1 = p_00->boundui; ppVar1 != (player_bound_ui *)0x0; ppVar1 = ppVar1->next) {
            pcVar5 = format("%s<%s>",ppVar1->name,list_element_names[lVar7]);
            pcVar5 = string_make(pcVar5);
            bind_player_ability_to_ui_entry_by_name
                      (pcVar5,ability,ppVar1->value,(_Bool)(ppVar1->isspecial ^ 1),ppVar1->isaux);
            string_free(pcVar5);
          }
          if ((lVar7 == 0x18) && (ppVar4 = ability, p_00->next == (embryo_player_ability *)0x0))
          break;
          ppVar4 = (player_ability *)mem_zalloc(0x30);
          ability->next = ppVar4;
          lVar7 = lVar7 + 1;
          ability = ppVar4;
        } while (lVar7 != 0x19);
        string_free((p_00->ability).type);
        string_free((p_00->ability).desc);
        string_free((p_00->ability).name);
        while (ppVar1 = p_00->boundui, ppVar1 != (player_bound_ui *)0x0) {
          p_00->boundui = ppVar1->next;
          string_free(ppVar1->name);
          mem_free(ppVar1);
        }
      }
      else {
        ability->type = pcVar5;
        ability->index = (p_00->ability).index;
        pcVar5 = (p_00->ability).desc;
        ability->name = (p_00->ability).name;
        ability->desc = pcVar5;
        while (ppVar1 = p_00->boundui, ppVar1 != (player_bound_ui *)0x0) {
          p_00->boundui = ppVar1->next;
          bind_player_ability_to_ui_entry_by_name
                    (ppVar1->name,ability,ppVar1->value,(_Bool)(ppVar1->isspecial ^ 1),ppVar1->isaux
                    );
          string_free(ppVar1->name);
          mem_free(ppVar1);
        }
        ppVar4 = ability;
        if (p_00->next != (embryo_player_ability *)0x0) {
          ppVar4 = (player_ability *)mem_zalloc(0x30);
          ability->next = ppVar4;
        }
      }
      peVar2 = p_00->next;
      mem_free(p_00);
      ability = ppVar4;
      p_00 = peVar2;
    } while (peVar2 != (embryo_player_ability *)0x0);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_player_prop(struct parser *p) {
	struct embryo_player_ability *embryo = embryo_player_abilities;
	struct embryo_player_ability *target;
	struct player_bound_ui *boundui_cursor;
	struct player_ability *new, *previous = NULL;

	embryo_player_abilities = NULL;
	/* Copy abilities over, making multiple copies for element types */
	player_abilities = mem_zalloc(sizeof(*player_abilities));
	new = player_abilities;
	while (embryo) {
		if (streq(embryo->ability.type, "element")) {
			uint16_t i, n;
			assert(N_ELEMENTS(list_element_names) < 65536);
			n = (uint16_t) N_ELEMENTS(list_element_names);
			for (i = 0; i < n - 1; i++) {
				char *name = string_make(projections[i].name);
				new->index = i;
				new->type = string_make(embryo->ability.type);
				new->desc = string_make(format("%s %s.", embryo->ability.desc, name));
				my_strcap(name);
				new->name = string_make(format("%s %s", name, embryo->ability.name));
				string_free(name);
				new->value = embryo->ability.value;
				boundui_cursor = embryo->boundui;
				while (boundui_cursor) {
					name = string_make(format("%s<%s>", boundui_cursor->name, list_element_names[i]));
					(void) bind_player_ability_to_ui_entry_by_name(name, new, boundui_cursor->value, !boundui_cursor->isspecial, boundui_cursor->isaux);
					string_free(name);
					boundui_cursor = boundui_cursor->next;
				}
				if ((i != n - 2) || embryo->next) {
					previous = new;
					new = mem_zalloc(sizeof(*new));
					previous->next = new;
				}
			}
			string_free(embryo->ability.type);
			string_free(embryo->ability.desc);
			string_free(embryo->ability.name);
			while (embryo->boundui) {
				boundui_cursor = embryo->boundui;
				embryo->boundui = embryo->boundui->next;
				string_free(boundui_cursor->name);
				mem_free(boundui_cursor);
			}
		} else {
			new->type = embryo->ability.type;
			new->index = embryo->ability.index;
			new->desc = embryo->ability.desc;
			new->name = embryo->ability.name;
			while (embryo->boundui) {
				boundui_cursor = embryo->boundui;
				embryo->boundui = embryo->boundui->next;
				(void) bind_player_ability_to_ui_entry_by_name(boundui_cursor->name, new, boundui_cursor->value, !boundui_cursor->isspecial, boundui_cursor->isaux);
				string_free(boundui_cursor->name);
				mem_free(boundui_cursor);
			}
			if (embryo->next) {
				previous = new;
				new = mem_zalloc(sizeof(*new));
				previous->next = new;
			}
		}
		target = embryo;
		embryo = embryo->next;
		mem_free(target);
	}
	parser_destroy(p);
	return 0;
}